

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsact.c
# Opt level: O1

void nrnmutex(int on,Item *q)

{
  if (on == 0) {
    if ((nrnmutex_toggle & 1) == 0) {
      diag("MUTEXUNLOCK invoked with no earlier MUTEXLOCK",(char *)0x0);
    }
    nrnmutex_toggle = 0;
  }
  else {
    if (on != 1) {
      if ((nrnmutex_toggle & 1) == 0) {
        nrnmutex_toggle = 0;
        return;
      }
      diag("MUTEXUNLOCK not invoked after MUTEXLOCK",(char *)0x0);
    }
    if ((nrnmutex_toggle & 1) != 0) {
      diag("MUTEXLOCK invoked after MUTEXLOCK",(char *)0x0);
    }
    nrnmutex_toggle = 1;
  }
  replacstr(q,"");
  protect_include_ = 1;
  return;
}

Assistant:

void nrnmutex(int on, Item* q) { /* MUTEXLOCK or MUTEXUNLOCK */
	static int toggle = 0;
	if (on == 1) {
		if (toggle != 0) {
			diag("MUTEXLOCK invoked after MUTEXLOCK", (char*)0);
		}
		toggle = 1;
		replacstr(q, "");
		protect_include_ = 1;
	}else if (on == 0) {
		if (toggle != 1) {
			diag("MUTEXUNLOCK invoked with no earlier MUTEXLOCK", (char*)0);
		}
		toggle = 0;
		replacstr(q, "");
		protect_include_ = 1;
	}else{
		if (toggle != 0) {
			diag("MUTEXUNLOCK not invoked after MUTEXLOCK", (char*)0);
		}
		toggle = 0;
	}
}